

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::XMLReader::getNCName(XMLReader *this,XMLBuffer *toFill)

{
  XMLCh XVar1;
  ulong uVar2;
  bool bVar3;
  XMLSize_t XVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar11 = this->fCharIndex;
  if (uVar11 == this->fCharsAvail) {
    bVar3 = refreshCharBuffer(this);
    if (bVar3) {
      uVar11 = this->fCharIndex;
      goto LAB_002bc39b;
    }
LAB_002bc3ec:
    bVar3 = false;
  }
  else {
LAB_002bc39b:
    XVar1 = this->fCharBuf[uVar11];
    if ((ushort)(XVar1 + L'⠀') < 0x380) {
      XVar4 = uVar11 + 1;
      if (XVar4 == this->fCharsAvail) {
        bVar3 = refreshCharBuffer(this);
        if (!bVar3) goto LAB_002bc3ec;
        uVar11 = this->fCharIndex;
        XVar4 = uVar11 + 1;
      }
      if ((ushort)(this->fCharBuf[XVar4] + L'\x2000') < 0xfc00) goto LAB_002bc3ec;
      uVar9 = uVar11 + 2;
    }
    else {
      if ((ulong)(ushort)XVar1 == 0x3a) {
        return false;
      }
      if ((this->fgCharCharsTable[(ushort)XVar1] & 2) == 0) {
        return false;
      }
      uVar9 = uVar11 + 1;
    }
    this->fCharIndex = uVar9;
    uVar5 = this->fCharsAvail;
    uVar7 = uVar9;
    uVar10 = uVar5;
    do {
      uVar8 = uVar7;
      if (uVar8 == uVar5) {
        XVar4 = uVar5 - uVar11;
        if (XVar4 != 0) {
          this->fCurCol = this->fCurCol + XVar4;
          XMLBuffer::append(toFill,this->fCharBuf + uVar11,XVar4);
        }
        bVar3 = refreshCharBuffer(this);
        if (!bVar3) {
          return true;
        }
        uVar8 = this->fCharIndex;
        uVar5 = this->fCharsAvail;
        uVar9 = uVar8;
        uVar10 = uVar5;
        uVar11 = uVar8;
      }
      uVar7 = uVar8;
      uVar2 = uVar5;
      if (uVar8 < uVar5) {
        do {
          uVar8 = uVar9;
          if ((ushort)(this->fCharBuf[uVar7] + L'⠀') < 0x380) {
            uVar6 = uVar7 + 1;
            bVar3 = uVar6 == uVar5;
            uVar5 = uVar10;
            if (bVar3) {
              XVar4 = uVar7 - uVar11;
              if (XVar4 != 0) {
                this->fCurCol = this->fCurCol + XVar4;
                XMLBuffer::append(toFill,this->fCharBuf + uVar11,XVar4);
              }
              bVar3 = refreshCharBuffer(this);
              uVar8 = this->fCharIndex;
              if (!bVar3) {
                uVar10 = this->fCharsAvail;
                uVar9 = uVar8;
                uVar2 = uVar10;
                break;
              }
              uVar6 = uVar8 + 1;
              uVar5 = this->fCharsAvail;
              uVar7 = uVar8;
              uVar11 = uVar8;
            }
            uVar9 = uVar8;
            uVar10 = uVar5;
            uVar2 = uVar5;
            if ((ushort)(this->fCharBuf[uVar6] + L'\x2000') < 0xfc00) break;
            uVar8 = uVar7 + 2;
          }
          else {
            uVar9 = uVar8;
            uVar2 = uVar10;
            if ((this->fgCharCharsTable[(ushort)this->fCharBuf[uVar7]] & 1) == 0) break;
            uVar8 = uVar7 + 1;
          }
          this->fCharIndex = uVar8;
          uVar7 = uVar8;
          uVar9 = uVar8;
          uVar2 = uVar10;
        } while (uVar8 < uVar5);
      }
      uVar5 = uVar2;
      uVar7 = uVar5;
    } while (uVar8 == uVar5);
    bVar3 = true;
    XVar4 = uVar8 - uVar11;
    if (XVar4 != 0) {
      this->fCurCol = this->fCurCol + XVar4;
      XMLBuffer::append(toFill,this->fCharBuf + uVar11,XVar4);
    }
  }
  return bVar3;
}

Assistant:

bool XMLReader::getNCName(XMLBuffer& toFill)
{
    if (fCharIndex == fCharsAvail && !refreshCharBuffer())
        return false;

    XMLSize_t charIndex_start = fCharIndex, count;
    //  Lets check the first char for being a first name char. If not, then
    //  what's the point in living mannnn? Just give up now. We only do this
    //  if its a name and not a name token that they want.
    if ((fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F)) {
        // if there isn't one more char in the buffer, read more data
        if (fCharIndex+1 == fCharsAvail)
        {
            if (!refreshCharBuffer())
                return false;
            // reset the start buffer to the new location of the cursor
            charIndex_start = fCharIndex;
        }
        if ((fCharBuf[fCharIndex+1] < 0xDC00) || (fCharBuf[fCharIndex+1] > 0xDFFF))
            return false;

        // Looks ok, so lets eat it
        fCharIndex += 2;
    }
    else {
        if (!isFirstNCNameChar(fCharBuf[fCharIndex])) {
            return false;
        }

        // Looks ok, so lets eat it
        fCharIndex++;
    }

    do
    {
        if (fCharIndex == fCharsAvail)
        {
            // we have to copy the accepted character(s), and update the column number,
            // before getting new data and losing the value of fCharIndex
            if((count = fCharIndex - charIndex_start)!=0)
            {
                fCurCol += (XMLFileLoc)count;
                toFill.append(&fCharBuf[charIndex_start], count);
            }
            if(!refreshCharBuffer())
                return true;
            charIndex_start = fCharIndex;
        }

        //  Check the current char and take it if it's a name char
        while(fCharIndex < fCharsAvail)
        {
            if((fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F))
            {
                // if there isn't one more char in the buffer, read more data
                if (fCharIndex+1 == fCharsAvail)
                {
                    // but first copy the accepted character(s), and update column
                    if (fCharIndex != charIndex_start)
                    {
                        fCurCol += (XMLFileLoc)(fCharIndex - charIndex_start);
                        toFill.append(&fCharBuf[charIndex_start], fCharIndex - charIndex_start);
                    }

                    if (!refreshCharBuffer())
                        break;

                    charIndex_start = fCharIndex;
                }
                if ( (fCharBuf[fCharIndex+1] < 0xDC00) ||
                    (fCharBuf[fCharIndex+1] > 0xDFFF)  )
                    break;
                fCharIndex += 2;
            }
            else if(isNCNameChar(fCharBuf[fCharIndex])) fCharIndex++;
            else break;
        }
        // if we didn't consume the entire buffer, we are done
    } while(fCharIndex == fCharsAvail);

    // we have to copy the accepted character(s), and update column
    if((count = fCharIndex - charIndex_start)!=0)
    {
        fCurCol += (XMLFileLoc)count;
        toFill.append(&fCharBuf[charIndex_start], count);
    }
    return true;
}